

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

uint32_t sx_hash_xxh32(void *data,size_t len,uint32_t seed)

{
  U32 UVar1;
  int *in_RCX;
  uint uVar2;
  XXH_alignment in_R8D;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if (len < 0x10) {
    iVar4 = seed + 0x165667b1;
  }
  else {
    in_RCX = (int *)((long)data + (len - 0xf));
    iVar4 = seed + 0x24234428;
    uVar3 = seed + 0x85ebca77;
    uVar2 = seed + 0x61c8864f;
    do {
      uVar5 = *data * -0x7a143589 + iVar4;
      uVar6 = uVar5 * 0x2000 | uVar5 >> 0x13;
      uVar3 = *(int *)((long)data + 4) * -0x7a143589 + uVar3;
      uVar8 = uVar3 * 0x2000 | uVar3 >> 0x13;
      iVar4 = uVar6 * -0x61c8864f;
      uVar3 = *(int *)((long)data + 8) * -0x7a143589 + seed;
      uVar7 = uVar3 * 0x2000 | uVar3 >> 0x13;
      uVar3 = uVar8 * -0x61c8864f;
      uVar2 = *(int *)((long)data + 0xc) * -0x7a143589 + uVar2;
      uVar5 = uVar2 * 0x2000 | uVar2 >> 0x13;
      seed = uVar7 * -0x61c8864f;
      uVar2 = uVar5 * -0x61c8864f;
      data = (void *)((long)data + 0x10);
    } while (data < in_RCX);
    in_R8D = (uVar8 * 0x1bbcd880 | uVar3 >> 0x19) + (uVar6 * 0x3c6ef362 | (uint)(iVar4 < 0));
    iVar4 = (uVar5 * -0x193c0000 | uVar2 >> 0xe) + (uVar7 * 0x779b1000 | seed >> 0x14) + in_R8D;
  }
  UVar1 = XXH32_finalize(iVar4 + (uint)len,data,(ulong)((uint)len & 0xf),(XXH_endianess)in_RCX,
                         in_R8D);
  return UVar1;
}

Assistant:

uint32_t sx_hash_xxh32(const void* data, size_t len, uint32_t seed)
{
    return XXH32(data, len, seed);
}